

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  char *__dest;
  anon_class_40_4_2c7d0318 add_thousands_sep;
  char *pcVar1;
  size_t __n;
  int digit_index;
  const_iterator group;
  int local_6c;
  num_writer *local_68;
  num_writer *pnStack_60;
  undefined8 local_58;
  undefined8 *puStack_50;
  int *local_48;
  undefined8 local_40;
  char local_38 [24];
  
  pnStack_60 = this + 0x10;
  local_48 = &local_6c;
  local_6c = 0;
  local_40 = **(undefined8 **)(this + 8);
  puStack_50 = &local_40;
  __dest = *it;
  local_58 = 1;
  add_thousands_sep.s.data_ = (char *)pnStack_60;
  add_thousands_sep.this = (num_writer *)this;
  add_thousands_sep.s.size_ = 1;
  add_thousands_sep.group = (const_iterator *)puStack_50;
  add_thousands_sep.digit_index = local_48;
  local_68 = this;
  pcVar1 = internal::operator()(local_38,*(uint *)this,*(int *)(this + 4),add_thousands_sep);
  __n = (long)pcVar1 - (long)local_38;
  if (__n != 0) {
    memcpy(__dest,local_38,__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It&& it) const {
        basic_string_view<char_type> s(&sep, sep_size);
        // Index of a decimal digit with the least significant digit having
        // index 0.
        int digit_index = 0;
        std::string::const_iterator group = groups.cbegin();
        it = format_decimal<char_type>(
            it, abs_value, size,
            [this, s, &group, &digit_index](char_type*& buffer) {
              if (*group <= 0 || ++digit_index % *group != 0 ||
                  *group == max_value<char>())
                return;
              if (group + 1 != groups.cend()) {
                digit_index = 0;
                ++group;
              }
              buffer -= s.size();
              std::uninitialized_copy(s.data(), s.data() + s.size(),
                                      make_checked(buffer, s.size()));
            });
      }